

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O1

void __thiscall QJsonArray::insert(QJsonArray *this,qsizetype i,QJsonValue *value)

{
  Type TVar1;
  QCborContainerPrivate *pQVar2;
  long in_FS_OFFSET;
  QCborValue local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->a).d.ptr;
  if (pQVar2 == (QCborContainerPrivate *)0x0) {
    pQVar2 = (QCborContainerPrivate *)operator_new(0x40);
    (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    pQVar2->usedData = 0;
    (pQVar2->data).d.d = (Data *)0x0;
    (pQVar2->data).d.ptr = (char *)0x0;
    (pQVar2->data).d.size = 0;
    (pQVar2->elements).d.d = (Data *)0x0;
    (pQVar2->elements).d.ptr = (Element *)0x0;
    (pQVar2->elements).d.size = 0;
    QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->a,pQVar2);
  }
  else {
    detach(this,(pQVar2->elements).d.size + 1);
  }
  pQVar2 = (this->a).d.ptr;
  TVar1 = QJsonValue::type(value);
  if (TVar1 == Undefined) {
    local_38.n = 0;
    local_38.container = (QCborContainerPrivate *)0x0;
    local_38.t = Null;
  }
  else {
    QCborValue::fromJsonValue(&local_38,value);
  }
  QCborContainerPrivate::insertAt(pQVar2,i,&local_38,CopyContainer);
  QCborValue::~QCborValue((QCborValue *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QJsonArray::insert(qsizetype i, const QJsonValue &value)
{
    if (a)
        detach(a->elements.size() + 1);
    else
        a = new QCborContainerPrivate;

    Q_ASSERT (i >= 0 && i <= a->elements.size());
    a->insertAt(i, value.type() == QJsonValue::Undefined ? QCborValue(nullptr)
                                                         : QCborValue::fromJsonValue(value));
}